

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugManager.cpp
# Opt level: O0

void __thiscall
Js::DebugManager::UpdateConsoleScope
          (DebugManager *this,DynamicObject *copyFromScope,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DynamicObject *object;
  PropertyRecord *this_00;
  char16 *pcVar6;
  BOOL updateSuccess;
  BOOL gotPropertyValue;
  PropertyDescriptor propertyDescriptor;
  uint local_30;
  PropertyId propertyId;
  uint32 i;
  uint32 newPropCount;
  DynamicObject *consoleScope;
  ScriptContext *scriptContext_local;
  DynamicObject *copyFromScope_local;
  DebugManager *this_local;
  
  if (copyFromScope == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                ,0xa9,"(copyFromScope != nullptr)","copyFromScope != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  object = GetConsoleScope(this,scriptContext);
  uVar3 = (*(copyFromScope->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
  local_30 = 0;
  do {
    if (uVar3 <= local_30) {
      uVar3 = (*(object->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[10])();
      Output::Trace(ConsoleScopePhase,
                    L"Number of properties on console scope object after update are %d\n",
                    (ulong)uVar3);
      return;
    }
    propertyDescriptor._44_4_ =
         (*(copyFromScope->super_RecyclableObject).super_FinalizableObject.
           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])
                   (copyFromScope,(ulong)(ushort)local_30);
    if (propertyDescriptor._44_4_ != -1) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&updateSuccess);
      BVar4 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                        (&copyFromScope->super_RecyclableObject,propertyDescriptor._44_4_,
                         scriptContext,(PropertyDescriptor *)&updateSuccess);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                    ,0xb5,"(gotPropertyValue)",
                                    "DebugManager::UpdateConsoleScope Should have got valid value?")
        ;
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      this_00 = ScriptContext::GetPropertyName(scriptContext,propertyDescriptor._44_4_);
      pcVar6 = PropertyRecord::GetBuffer(this_00);
      Output::Trace(ConsoleScopePhase,L"Adding property \'%s\'\n",pcVar6);
      BVar4 = Js::JavascriptOperators::SetPropertyDescriptor
                        (&object->super_RecyclableObject,propertyDescriptor._44_4_,
                         (PropertyDescriptor *)&updateSuccess);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DebugManager.cpp"
                                    ,0xba,"(updateSuccess)",
                                    "DebugManager::UpdateConsoleScope Unable to update property value. Am I missing a scenario?"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void DebugManager::UpdateConsoleScope(DynamicObject* copyFromScope, ScriptContext* scriptContext)
    {
        Assert(copyFromScope != nullptr);
        DynamicObject* consoleScope = this->GetConsoleScope(scriptContext);

        uint32 newPropCount = copyFromScope->GetPropertyCount();
        for (uint32 i = 0; i < newPropCount; i++)
        {
            Js::PropertyId propertyId = copyFromScope->GetPropertyId((Js::PropertyIndex)i);
            // For deleted properties we won't have a property id
            if (propertyId != Js::Constants::NoProperty)
            {
                PropertyDescriptor propertyDescriptor;
                BOOL gotPropertyValue = JavascriptOperators::GetOwnPropertyDescriptor(copyFromScope, propertyId, scriptContext, &propertyDescriptor);
                AssertMsg(gotPropertyValue, "DebugManager::UpdateConsoleScope Should have got valid value?");

                OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Adding property '%s'\n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());

                BOOL updateSuccess = JavascriptOperators::SetPropertyDescriptor(consoleScope, propertyId, propertyDescriptor);
                AssertMsg(updateSuccess, "DebugManager::UpdateConsoleScope Unable to update property value. Am I missing a scenario?");
            }
        }

        OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Number of properties on console scope object after update are %d\n"), consoleScope->GetPropertyCount());
    }